

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  ZSTD_compressedBlockState_t *pZVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_cwksp_alloc_phase_e ZVar4;
  ZSTD_freeFunction p_Var5;
  char *pcVar6;
  ZSTD_allocFunction p_Var7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_strategy ZVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 in_EAX;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  seqDef *psVar21;
  ldmEntry_t *__s;
  rawSeq *prVar22;
  ZSTD_Sequence *pZVar23;
  void *pvVar24;
  void *pvVar25;
  ZSTD_compressedBlockState_t *pZVar26;
  U32 *pUVar27;
  ulong uVar28;
  size_t buffInSize;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t buffOutSize;
  ZSTD_indexResetPolicy_e forceResetIndex;
  char *pcVar32;
  size_t __n;
  BYTE *pBVar33;
  BYTE *pBVar34;
  size_t err_code;
  undefined1 auVar35 [16];
  ulong local_48;
  
  auVar35._0_4_ = -(uint)(0x7fffffe9 < (int)((params->cParams).windowLog - 0x20 ^ 0x80000000));
  auVar35._4_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).chainLog - 0x1f ^ 0x80000000));
  auVar35._8_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).hashLog - 0x1f ^ 0x80000000));
  auVar35._12_4_ = -(uint)(0x7fffffe1 < (int)((params->cParams).searchLog - 0x1f ^ 0x80000000));
  iVar16 = movmskps(in_EAX,auVar35);
  if ((((iVar16 != 0xf) || (4 < (params->cParams).minMatch - 3)) ||
      (0x20000 < (params->cParams).targetLength)) || (8 < (params->cParams).strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58bf,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58c9,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58ca,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  ZVar3 = (zc->appliedParams).ldmParams.enableLdm;
  if (ZVar3 == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cb,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  sVar18 = (zc->appliedParams).maxBlockSize;
  if (sVar18 == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cc,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  params_00 = &(zc->appliedParams).ldmParams;
  if (ZVar3 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d1,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    sVar18 = (zc->appliedParams).maxBlockSize;
  }
  uVar29 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar29) {
    uVar29 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar29 = 1;
  }
  uVar30 = uVar29;
  if (sVar18 < uVar29) {
    uVar30 = sVar18;
  }
  iVar16 = (zc->appliedParams).useSequenceProducer;
  uVar28 = 4 - (ulong)(iVar16 != 0 || (zc->appliedParams).cParams.minMatch == 3);
  buffOutSize = 0;
  uVar17 = uVar30 / uVar28;
  buffInSize = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (uVar30 < 0xff00ff00ff00ff00) {
        uVar31 = 0;
        if (uVar30 < 0x20000) {
          uVar31 = (ulong)(0x20000U - (int)uVar30 >> 0xb);
        }
        lVar19 = uVar31 + (uVar30 >> 8) + uVar30;
        if (lVar19 == 0) goto LAB_001913b8;
      }
      else {
LAB_001913b8:
        lVar19 = -0x48;
      }
      buffOutSize = lVar19 + 1;
    }
    else {
      buffOutSize = 0;
    }
    buffInSize = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      buffInSize = uVar29 + uVar30;
    }
  }
  if (params_00->enableLdm == ZSTD_ps_enable) {
    local_48 = uVar30 / (zc->appliedParams).ldmParams.minMatchLength;
  }
  else {
    local_48 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar18 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,buffInSize,buffOutSize,pledgedSrcSize,
                      iVar16,sVar18);
  if (0xffffffffffffff88 < sVar18) {
    return sVar18;
  }
  sVar20 = zc->staticSize;
  if (sVar20 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar25 = (zc->workspace).workspace;
  pvVar24 = (zc->workspace).workspaceEnd;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar18 * 3) {
    bVar8 = false;
  }
  else {
    bVar8 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)pvVar24 - (long)pvVar25) < sVar18) || (bVar8)) {
    if (sVar20 != 0) {
      return 0xffffffffffffffc0;
    }
    p_Var5 = (zc->customMem).customFree;
    pvVar24 = (zc->customMem).opaque;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (pvVar25 != (void *)0x0) {
      if (p_Var5 == (ZSTD_freeFunction)0x0) {
        free(pvVar25);
      }
      else {
        (*p_Var5)(pvVar24,pvVar25);
      }
    }
    p_Var7 = (zc->customMem).customAlloc;
    if (p_Var7 == (ZSTD_allocFunction)0x0) {
      pvVar25 = malloc(sVar18);
    }
    else {
      pvVar25 = (*p_Var7)((zc->customMem).opaque,sVar18);
    }
    if (pvVar25 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (((ulong)pvVar25 & 7) != 0) {
      __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4330,
                    "void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t, ZSTD_cwksp_static_alloc_e)")
      ;
    }
    (zc->workspace).workspace = pvVar25;
    (zc->workspace).workspaceEnd = (void *)((long)pvVar25 + sVar18);
    (zc->workspace).objectEnd = pvVar25;
    (zc->workspace).tableValidEnd = pvVar25;
    pvVar24 = (void *)((ulong)((long)pvVar25 + sVar18) & 0xffffffffffffffc0);
    (zc->workspace).initOnceStart = pvVar24;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableEnd = pvVar25;
    (zc->workspace).allocStart = pvVar24;
    (zc->workspace).allocFailed = '\0';
    ZSTD_cwksp_assert_internal_consistency(ws);
    (zc->workspace).workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x2c00) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5905,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar26 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
    if (((ulong)pZVar26 & 7) != 0) {
      __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x429d,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((zc->workspace).phase != ZSTD_cwksp_alloc_objects) ||
       (pZVar2 = pZVar26 + 1, (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar2))
    {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    (zc->workspace).objectEnd = pZVar2;
    (zc->workspace).tableEnd = pZVar2;
    (zc->workspace).tableValidEnd = pZVar2;
    (zc->blockState).prevCBlock = pZVar26;
    if (pZVar26 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar26 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).nextCBlock = pZVar26;
    if (pZVar26 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar27 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
    zc->entropyWorkspace = pUVar27;
    if (pUVar27 == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
    pvVar24 = (zc->workspace).workspaceEnd;
    forceResetIndex = ZSTDirp_reset;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (void *)((ulong)pvVar24 & 0xffffffffffffffc0);
  (zc->workspace).allocFailed = '\0';
  if (ZSTD_cwksp_alloc_aligned_init_once < (zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned_init_once;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  uVar12 = cParams->windowLog;
  uVar13 = cParams->chainLog;
  uVar14 = (zc->appliedParams).cParams.hashLog;
  uVar15 = (zc->appliedParams).cParams.searchLog;
  uVar9 = (zc->appliedParams).cParams.minMatch;
  uVar10 = (zc->appliedParams).cParams.targetLength;
  ZVar11 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar9;
  (zc->blockState).matchState.cParams.targetLength = uVar10;
  (zc->blockState).matchState.cParams.strategy = ZVar11;
  (zc->blockState).matchState.cParams.windowLog = uVar12;
  (zc->blockState).matchState.cParams.chainLog = uVar13;
  (zc->blockState).matchState.cParams.hashLog = uVar14;
  (zc->blockState).matchState.cParams.searchLog = uVar15;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar30;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v[0] = 0;
  (zc->xxhState).v[1] = 0;
  (zc->xxhState).v[2] = 0;
  (zc->xxhState).v[3] = 0;
  (zc->xxhState).mem64[0] = 0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  (zc->xxhState).mem64[3] = 0;
  (zc->xxhState).memsize = 0;
  (zc->xxhState).reserved32 = 0;
  lVar19 = 0;
  (zc->xxhState).reserved64 = 0;
  (zc->xxhState).v[0] = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v[1] = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v[3] = 0x61c8864e7a143579;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar26 = (zc->blockState).prevCBlock;
  do {
    *(undefined4 *)((long)pZVar26->rep + lVar19) = *(undefined4 *)((long)repStartValue + lVar19);
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0xc);
  (pZVar26->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar26->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar26->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar26->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  sVar20 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar20) {
    return sVar20;
  }
  psVar21 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,uVar17 * 8);
  (zc->seqStore).sequencesStart = psVar21;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar20 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
    __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar20);
    (zc->ldmState).hashTable = __s;
    memset(__s,0,sVar20);
    prVar22 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,local_48 * 0xc);
    zc->ldmSequences = prVar22;
    zc->maxNbLdmSequences = local_48;
    *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).window.base = " ";
    (zc->ldmState).window.dictBase = " ";
    (zc->ldmState).window.dictLimit = 2;
    (zc->ldmState).window.lowLimit = 2;
    (zc->ldmState).window.nextSrc = (BYTE *)"\r%79s\r";
    (zc->ldmState).loadedDictEnd = 0;
  }
  if ((zc->appliedParams).useSequenceProducer != 0) {
    sVar20 = uVar30 / 3 + 1;
    (zc->externalMatchCtx).seqBufferCapacity = sVar20;
    pZVar23 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar20 * 0x10);
    (zc->externalMatchCtx).seqBuffer = pZVar23;
  }
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001917fe:
    if (uVar30 == 0xffffffffffffffe0) goto LAB_00191804;
    pBVar34 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - uVar30));
    pBVar33 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar34 < pBVar33) goto LAB_00192108;
    if (pBVar34 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar34;
    }
    (zc->workspace).allocStart = pBVar34;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001917e6:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001917fe;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_001917e6;
    }
LAB_00191804:
    pBVar34 = (BYTE *)0x0;
  }
  (zc->seqStore).litStart = pBVar34;
  (zc->seqStore).maxNbLit = uVar30;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = buffInSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191949:
    if (buffInSize == 0) goto LAB_0019199d;
    pcVar32 = (char *)((long)(zc->workspace).allocStart - buffInSize);
    pcVar6 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar32 < pcVar6) goto LAB_00192108;
    if (pcVar32 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar32;
    }
    (zc->workspace).allocStart = pcVar32;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191931:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00191949;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_00191931;
    }
LAB_0019199d:
    pcVar32 = (char *)0x0;
  }
  zc->inBuff = pcVar32;
  zc->outBuffSize = buffOutSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191a3b:
    if (buffOutSize == 0) goto LAB_00191a86;
    pcVar32 = (char *)((long)(zc->workspace).allocStart - buffOutSize);
    pcVar6 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar32 < pcVar6) goto LAB_00192108;
    if (pcVar32 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar32;
    }
    (zc->workspace).allocStart = pcVar32;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191a1f:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00191a3b;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_00191a1f;
    }
LAB_00191a86:
    pcVar32 = (char *)0x0;
  }
  zc->outBuff = pcVar32;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZVar4 = (zc->workspace).phase;
    __n = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                 (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
    if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191cc6:
      pBVar34 = (BYTE *)((long)(zc->workspace).allocStart - __n);
      pBVar33 = (BYTE *)(zc->workspace).tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar34 < pBVar33) goto LAB_00192108;
      if (pBVar34 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar34;
      }
      (zc->workspace).allocStart = pBVar34;
    }
    else {
      if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191cb4:
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        ZSTD_cwksp_assert_internal_consistency(ws);
        goto LAB_00191cc6;
      }
      pvVar25 = (zc->workspace).workspaceEnd;
      pvVar24 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar24;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
      uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
      pvVar24 = (void *)((long)pvVar24 + uVar29);
      if (pvVar24 <= pvVar25) {
        (zc->workspace).objectEnd = pvVar24;
        (zc->workspace).tableEnd = pvVar24;
        if (uVar29 != 0) {
          (zc->workspace).tableValidEnd = pvVar24;
        }
        goto LAB_00191cb4;
      }
      pBVar34 = (BYTE *)0x0;
    }
    (zc->ldmState).bucketOffsets = pBVar34;
    memset(pBVar34,0,__n);
  }
  if ((zc->stage == ZSTDcs_init) && (params_00->enableLdm != ZSTD_ps_enable)) {
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
  }
  (zc->seqStore).maxNbSeq = uVar17;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191dd0:
    if (uVar30 < uVar28) goto LAB_00191dd7;
    pBVar34 = (BYTE *)((long)(zc->workspace).allocStart - uVar17);
    pBVar33 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar34 < pBVar33) goto LAB_00192108;
    if (pBVar34 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar34;
    }
    (zc->workspace).allocStart = pBVar34;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191dbe:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00191dd0;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_00191dbe;
    }
LAB_00191dd7:
    pBVar34 = (BYTE *)0x0;
  }
  (zc->seqStore).llCode = pBVar34;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001920ab;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191e9a:
    if (uVar30 < uVar28) goto LAB_00191ea1;
    pBVar34 = (BYTE *)((long)(zc->workspace).allocStart - uVar17);
    pBVar33 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar34 < pBVar33) goto LAB_00192108;
    if (pBVar34 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar34;
    }
    (zc->workspace).allocStart = pBVar34;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191e88:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00191e9a;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_00191e88;
    }
LAB_00191ea1:
    pBVar34 = (BYTE *)0x0;
  }
  (zc->seqStore).mlCode = pBVar34;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) {
LAB_001920ab:
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x41e6,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_00191f6d:
    pBVar33 = (BYTE *)(zc->workspace).allocStart;
    if (uVar28 <= uVar30) {
      pBVar34 = pBVar33 + -uVar17;
      pBVar33 = (BYTE *)(zc->workspace).tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar34 < pBVar33) {
LAB_00192108:
        __assert_fail("alloc >= bottom",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x41cf,
                      "void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)");
      }
      if (pBVar34 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar34;
      }
      (zc->workspace).allocStart = pBVar34;
      pBVar33 = pBVar34;
      goto LAB_00191fbc;
    }
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_00191f5b:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_00191f6d;
    }
    pvVar25 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar25 & 0xffffffffffffffc0);
    uVar29 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar29);
    if (pvVar24 <= pvVar25) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar29 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_00191f5b;
    }
    pBVar33 = (BYTE *)(zc->workspace).allocStart;
  }
  pBVar34 = (BYTE *)0x0;
LAB_00191fbc:
  (zc->seqStore).ofCode = pBVar34;
  uVar29 = ((long)(zc->workspace).tableEnd + (long)(zc->workspace).workspaceEnd) -
           (long)(pBVar33 + (long)(zc->workspace).workspace);
  if ((sVar18 - 0x80 <= uVar29) && (uVar29 <= sVar18)) {
    zc->initialized = 1;
    return 0;
  }
  __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5963,
                "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
               );
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}